

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

void * clSharedMemAllocINTEL_EMU
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  CLIntercept *this;
  SConfig *pSVar1;
  void *pvVar2;
  CLIntercept *pIntercept;
  cl_context in_stack_00000040;
  CLIntercept *in_stack_00000048;
  cl_int *in_stack_00000060;
  
  this = GetIntercept();
  if (this != (CLIntercept *)0x0) {
    pSVar1 = CLIntercept::config(this);
    if ((pSVar1->Emulate_cl_intel_unified_shared_memory & 1U) != 0) {
      pvVar2 = CLIntercept::emulatedSharedMemAlloc
                         (in_stack_00000048,in_stack_00000040,(cl_device_id)context,
                          (cl_mem_properties_intel *)device,(size_t)properties,size._4_4_,
                          in_stack_00000060);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void* CL_API_CALL clSharedMemAllocINTEL_EMU(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedSharedMemAlloc(
            context,
            device,
            properties,
            size,
            alignment,
            errcode_ret );
    }

    return NULL;
}